

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

char16_t * __thiscall QUtf8::convertToUnicode(QUtf8 *this,char16_t *dst,QByteArrayView in)

{
  undefined1 auVar1 [16];
  uchar b;
  ushort uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  long lVar21;
  bool bVar22;
  long lVar23;
  qsizetype qVar24;
  long lVar25;
  qptrdiff offset;
  uchar *end;
  QUtf8 **ppQVar26;
  long in_FS_OFFSET;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  QByteArrayView local_88;
  uchar *local_78;
  uchar *src;
  QUtf8 *local_68;
  anon_class_32_4_99005a4f local_60;
  uchar *local_40;
  long local_38;
  
  ppQVar26 = (QUtf8 **)in.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.m_size = 3;
  local_88.m_data = (storage_type *)utf8bom;
  if (2 < (long)dst) {
    local_60.src = (uchar **)0x3;
    local_60.dst = (char16_t **)ppQVar26;
    bVar22 = comparesEqual((QByteArrayView *)&local_60,&local_88);
    if (bVar22) {
      ppQVar26 = (QUtf8 **)((long)ppQVar26 + 3);
      dst = (char16_t *)((long)dst + -3);
    }
  }
  end = (uchar *)((long)dst + (long)ppQVar26);
  src = (uchar *)ppQVar26;
  local_68 = this;
  while (src < end) {
    lVar23 = (long)end - (long)src;
    local_78 = end;
    local_60.src = &src;
    local_60.dst = (char16_t **)&local_68;
    local_60.nextAscii = &local_78;
    local_60.end = &local_40;
    local_40 = end;
    if (0xf < lVar23) {
      lVar21 = 0x10;
      do {
        lVar25 = lVar21;
        if (lVar23 <= lVar25) {
          local_68 = local_68 + lVar23 * 2;
          auVar1 = *(undefined1 (*) [16])(end + -0x10);
          uVar2 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
          auVar4[0xd] = 0;
          auVar4._0_13_ = auVar1._0_13_;
          auVar4[0xe] = auVar1[7];
          auVar6[0xc] = auVar1[6];
          auVar6._0_12_ = auVar1._0_12_;
          auVar6._13_2_ = auVar4._13_2_;
          auVar8[0xb] = 0;
          auVar8._0_11_ = auVar1._0_11_;
          auVar8._12_3_ = auVar6._12_3_;
          auVar10[10] = auVar1[5];
          auVar10._0_10_ = auVar1._0_10_;
          auVar10._11_4_ = auVar8._11_4_;
          auVar12[9] = 0;
          auVar12._0_9_ = auVar1._0_9_;
          auVar12._10_5_ = auVar10._10_5_;
          auVar14[8] = auVar1[4];
          auVar14._0_8_ = auVar1._0_8_;
          auVar14._9_6_ = auVar12._9_6_;
          auVar16._7_8_ = 0;
          auVar16._0_7_ = auVar14._8_7_;
          auVar19._1_8_ = SUB158(auVar16 << 0x40,7);
          auVar19[0] = auVar1[3];
          auVar19._9_6_ = 0;
          auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
          auVar20[0] = auVar1[2];
          auVar20._11_4_ = 0;
          auVar30._3_12_ = SUB1512(auVar20 << 0x20,3);
          auVar30[2] = auVar1[1];
          auVar30[0] = auVar1[0];
          auVar30[1] = 0;
          auVar30[0xf] = 0;
          *(undefined1 (*) [16])(local_68 + -0x20) = auVar30;
          auVar28[1] = 0;
          auVar28[0] = auVar1[8];
          auVar28[2] = auVar1[9];
          auVar28[3] = 0;
          auVar28[4] = auVar1[10];
          auVar28[5] = 0;
          auVar28[6] = auVar1[0xb];
          auVar28[7] = 0;
          auVar28[8] = auVar1[0xc];
          auVar28[9] = 0;
          auVar28[10] = auVar1[0xd];
          auVar28[0xb] = 0;
          auVar28[0xc] = auVar1[0xe];
          auVar28[0xd] = 0;
          auVar28[0xe] = auVar1[0xf];
          auVar28[0xf] = 0;
          *(undefined1 (*) [16])(local_68 + -0x10) = auVar28;
          offset = -0x10;
          src = end;
          goto LAB_0011f4c5;
        }
        auVar1 = *(undefined1 (*) [16])(src + lVar25 + -0x10);
        uVar2 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
        auVar3[0xd] = 0;
        auVar3._0_13_ = auVar1._0_13_;
        auVar3[0xe] = auVar1[7];
        auVar5[0xc] = auVar1[6];
        auVar5._0_12_ = auVar1._0_12_;
        auVar5._13_2_ = auVar3._13_2_;
        auVar7[0xb] = 0;
        auVar7._0_11_ = auVar1._0_11_;
        auVar7._12_3_ = auVar5._12_3_;
        auVar9[10] = auVar1[5];
        auVar9._0_10_ = auVar1._0_10_;
        auVar9._11_4_ = auVar7._11_4_;
        auVar11[9] = 0;
        auVar11._0_9_ = auVar1._0_9_;
        auVar11._10_5_ = auVar9._10_5_;
        auVar13[8] = auVar1[4];
        auVar13._0_8_ = auVar1._0_8_;
        auVar13._9_6_ = auVar11._9_6_;
        auVar15._7_8_ = 0;
        auVar15._0_7_ = auVar13._8_7_;
        auVar17._1_8_ = SUB158(auVar15 << 0x40,7);
        auVar17[0] = auVar1[3];
        auVar17._9_6_ = 0;
        auVar18._1_10_ = SUB1510(auVar17 << 0x30,5);
        auVar18[0] = auVar1[2];
        auVar18._11_4_ = 0;
        auVar29._3_12_ = SUB1512(auVar18 << 0x20,3);
        auVar29[2] = auVar1[1];
        auVar29[0] = auVar1[0];
        auVar29[1] = 0;
        auVar29[0xf] = 0;
        *(undefined1 (*) [16])(local_68 + lVar25 * 2 + -0x20) = auVar29;
        auVar27[1] = 0;
        auVar27[0] = auVar1[8];
        auVar27[2] = auVar1[9];
        auVar27[3] = 0;
        auVar27[4] = auVar1[10];
        auVar27[5] = 0;
        auVar27[6] = auVar1[0xb];
        auVar27[7] = 0;
        auVar27[8] = auVar1[0xc];
        auVar27[9] = 0;
        auVar27[10] = auVar1[0xd];
        auVar27[0xb] = 0;
        auVar27[0xc] = auVar1[0xe];
        auVar27[0xd] = 0;
        auVar27[0xe] = auVar1[0xf];
        auVar27[0xf] = 0;
        *(undefined1 (*) [16])(local_68 + lVar25 * 2 + -0x10) = auVar27;
        lVar21 = lVar25 + 0x10;
      } while (uVar2 == 0);
      offset = lVar25 + -0x10;
LAB_0011f4c5:
      bVar22 = simdDecodeAscii<1UL>::anon_class_32_4_99005a4f::operator()
                         (&local_60,(uint)uVar2,offset);
      if (bVar22) break;
    }
    do {
      b = *src;
      src = src + 1;
      qVar24 = QUtf8Functions::fromUtf8<QUtf8BaseTraits,char16_t*,unsigned_char_const*>
                         (b,(char16_t **)&local_68,&src,end);
      if (qVar24 < 0) {
        *(char16_t *)local_68 = L'�';
        local_68 = local_68 + 2;
      }
    } while (src < local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (char16_t *)local_68;
}

Assistant:

char16_t *QUtf8::convertToUnicode(char16_t *dst, QByteArrayView in) noexcept
{
    // check if have to skip a BOM
    auto bom = QByteArrayView::fromArray(utf8bom);
    if (in.size() >= bom.size() && in.first(bom.size()) == bom)
        in.slice(sizeof(utf8bom));

    return convertToUnicode(dst, in, [](char16_t *&dst, ...) {
        // decoding error
        *dst++ = QChar::ReplacementCharacter;
        return true;        // continue decoding
    });
}